

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

bool __thiscall cmCTestMemCheckHandler::InitializeMemoryChecking(cmCTestMemCheckHandler *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *__rhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  cmCTest *pcVar2;
  size_type sVar3;
  bool bVar4;
  long lVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  ostream *poVar7;
  string *psVar8;
  int iVar9;
  string extraOptions;
  string memoryTesterOptions;
  allocator<char> local_229;
  string suppressionsOption;
  string local_208;
  string outputFile;
  string local_1c8;
  string testerName;
  
  (this->MemoryTesterEnvironmentVariable)._M_string_length = 0;
  *(this->MemoryTesterEnvironmentVariable)._M_dataplus._M_p = '\0';
  (this->MemoryTester)._M_string_length = 0;
  *(this->MemoryTester)._M_dataplus._M_p = '\0';
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&memoryTesterOptions,"MemoryCheckCommand",(allocator<char> *)&extraOptions);
  cmCTest::GetCTestConfiguration(&testerName,pcVar2,&memoryTesterOptions);
  bVar4 = cmsys::SystemTools::FileExists(&testerName);
  psVar8 = &this->MemoryTester;
  std::__cxx11::string::~string((string *)&testerName);
  std::__cxx11::string::~string((string *)&memoryTesterOptions);
  if (bVar4) {
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&memoryTesterOptions,"MemoryCheckCommand",(allocator<char> *)&extraOptions)
    ;
    cmCTest::GetCTestConfiguration(&testerName,pcVar2,&memoryTesterOptions);
    std::__cxx11::string::operator=((string *)psVar8,(string *)&testerName);
    std::__cxx11::string::~string((string *)&testerName);
    std::__cxx11::string::~string((string *)&memoryTesterOptions);
    cmsys::SystemTools::GetFilenameName(&testerName,psVar8);
    lVar5 = std::__cxx11::string::find((char *)&testerName,0x70dfd9);
    iVar9 = 1;
    if (lVar5 == -1) {
      pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&extraOptions,"MemoryCheckType",(allocator<char> *)&suppressionsOption);
      cmCTest::GetCTestConfiguration(&memoryTesterOptions,pcVar2,&extraOptions);
      bVar4 = std::operator==(&memoryTesterOptions,"Valgrind");
      std::__cxx11::string::~string((string *)&memoryTesterOptions);
      std::__cxx11::string::~string((string *)&extraOptions);
      if (!bVar4) {
        lVar5 = std::__cxx11::string::find((char *)&testerName,0x70dff2);
        iVar9 = 3;
        if (lVar5 == -1) {
          pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&extraOptions,"MemoryCheckType",
                     (allocator<char> *)&suppressionsOption);
          cmCTest::GetCTestConfiguration(&memoryTesterOptions,pcVar2,&extraOptions);
          bVar4 = std::operator==(&memoryTesterOptions,"DrMemory");
          std::__cxx11::string::~string((string *)&memoryTesterOptions);
          std::__cxx11::string::~string((string *)&extraOptions);
          if (!bVar4) {
            lVar5 = std::__cxx11::string::find((char *)&testerName,0x70dffb);
            if (lVar5 == -1) {
              lVar5 = std::__cxx11::string::find((char *)&testerName,0x70e002);
              if (lVar5 == -1) {
                lVar5 = std::__cxx11::string::find((char *)&testerName,0x70e005);
                if (lVar5 == -1) {
                  lVar5 = std::__cxx11::string::find((char *)&testerName,0x70e013);
                  iVar9 = (uint)(lVar5 != -1) * 5;
                }
                else {
                  iVar9 = 5;
                }
              }
              else {
                iVar9 = 4;
              }
            }
            else {
              iVar9 = 2;
            }
          }
        }
      }
    }
    this->MemoryTesterStyle = iVar9;
    std::__cxx11::string::~string((string *)&testerName);
  }
  else {
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&memoryTesterOptions,"PurifyCommand",(allocator<char> *)&extraOptions);
    cmCTest::GetCTestConfiguration(&testerName,pcVar2,&memoryTesterOptions);
    bVar4 = cmsys::SystemTools::FileExists(&testerName);
    std::__cxx11::string::~string((string *)&testerName);
    std::__cxx11::string::~string((string *)&memoryTesterOptions);
    if (bVar4) {
      pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&memoryTesterOptions,"PurifyCommand",(allocator<char> *)&extraOptions);
      cmCTest::GetCTestConfiguration(&testerName,pcVar2,&memoryTesterOptions);
      std::__cxx11::string::operator=((string *)psVar8,(string *)&testerName);
      std::__cxx11::string::~string((string *)&testerName);
      std::__cxx11::string::~string((string *)&memoryTesterOptions);
      this->MemoryTesterStyle = 2;
    }
    else {
      pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&memoryTesterOptions,"ValgrindCommand",(allocator<char> *)&extraOptions);
      cmCTest::GetCTestConfiguration(&testerName,pcVar2,&memoryTesterOptions);
      bVar4 = cmsys::SystemTools::FileExists(&testerName);
      std::__cxx11::string::~string((string *)&testerName);
      std::__cxx11::string::~string((string *)&memoryTesterOptions);
      if (bVar4) {
        pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&memoryTesterOptions,"ValgrindCommand",(allocator<char> *)&extraOptions
                  );
        cmCTest::GetCTestConfiguration(&testerName,pcVar2,&memoryTesterOptions);
        std::__cxx11::string::operator=((string *)psVar8,(string *)&testerName);
        std::__cxx11::string::~string((string *)&testerName);
        std::__cxx11::string::~string((string *)&memoryTesterOptions);
        this->MemoryTesterStyle = 1;
      }
      else {
        pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&memoryTesterOptions,"DrMemoryCommand",(allocator<char> *)&extraOptions
                  );
        cmCTest::GetCTestConfiguration(&testerName,pcVar2,&memoryTesterOptions);
        bVar4 = cmsys::SystemTools::FileExists(&testerName);
        std::__cxx11::string::~string((string *)&testerName);
        std::__cxx11::string::~string((string *)&memoryTesterOptions);
        if (bVar4) {
          pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&memoryTesterOptions,"DrMemoryCommand",
                     (allocator<char> *)&extraOptions);
          cmCTest::GetCTestConfiguration(&testerName,pcVar2,&memoryTesterOptions);
          std::__cxx11::string::operator=((string *)psVar8,(string *)&testerName);
          std::__cxx11::string::~string((string *)&testerName);
          std::__cxx11::string::~string((string *)&memoryTesterOptions);
          this->MemoryTesterStyle = 3;
        }
        else {
          pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&memoryTesterOptions,"BoundsCheckerCommand",
                     (allocator<char> *)&extraOptions);
          cmCTest::GetCTestConfiguration(&testerName,pcVar2,&memoryTesterOptions);
          bVar4 = cmsys::SystemTools::FileExists(&testerName);
          std::__cxx11::string::~string((string *)&testerName);
          std::__cxx11::string::~string((string *)&memoryTesterOptions);
          if (bVar4) {
            pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&memoryTesterOptions,"BoundsCheckerCommand",
                       (allocator<char> *)&extraOptions);
            cmCTest::GetCTestConfiguration(&testerName,pcVar2,&memoryTesterOptions);
            std::__cxx11::string::operator=((string *)psVar8,(string *)&testerName);
            std::__cxx11::string::~string((string *)&testerName);
            std::__cxx11::string::~string((string *)&memoryTesterOptions);
            this->MemoryTesterStyle = 4;
          }
          else {
            pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&memoryTesterOptions,"CudaSanitizerCommand",
                       (allocator<char> *)&extraOptions);
            cmCTest::GetCTestConfiguration(&testerName,pcVar2,&memoryTesterOptions);
            bVar4 = cmsys::SystemTools::FileExists(&testerName);
            std::__cxx11::string::~string((string *)&testerName);
            std::__cxx11::string::~string((string *)&memoryTesterOptions);
            if (bVar4) {
              pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&memoryTesterOptions,"CudaSanitizerCommand",
                         (allocator<char> *)&extraOptions);
              cmCTest::GetCTestConfiguration(&testerName,pcVar2,&memoryTesterOptions);
              std::__cxx11::string::operator=((string *)psVar8,(string *)&testerName);
              std::__cxx11::string::~string((string *)&testerName);
              std::__cxx11::string::~string((string *)&memoryTesterOptions);
              this->MemoryTesterStyle = 5;
            }
          }
        }
      }
    }
  }
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&memoryTesterOptions,"MemoryCheckType",(allocator<char> *)&extraOptions);
  cmCTest::GetCTestConfiguration(&testerName,pcVar2,&memoryTesterOptions);
  bVar4 = std::operator==(&testerName,"AddressSanitizer");
  std::__cxx11::string::~string((string *)&testerName);
  std::__cxx11::string::~string((string *)&memoryTesterOptions);
  if (bVar4) {
    cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)psVar8);
    this->MemoryTesterStyle = 6;
    this->LogWithPID = true;
  }
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&memoryTesterOptions,"MemoryCheckType",(allocator<char> *)&extraOptions);
  cmCTest::GetCTestConfiguration(&testerName,pcVar2,&memoryTesterOptions);
  bVar4 = std::operator==(&testerName,"LeakSanitizer");
  std::__cxx11::string::~string((string *)&testerName);
  std::__cxx11::string::~string((string *)&memoryTesterOptions);
  if (bVar4) {
    cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)psVar8);
    this->MemoryTesterStyle = 7;
    this->LogWithPID = true;
  }
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&memoryTesterOptions,"MemoryCheckType",(allocator<char> *)&extraOptions);
  cmCTest::GetCTestConfiguration(&testerName,pcVar2,&memoryTesterOptions);
  bVar4 = std::operator==(&testerName,"ThreadSanitizer");
  std::__cxx11::string::~string((string *)&testerName);
  std::__cxx11::string::~string((string *)&memoryTesterOptions);
  if (bVar4) {
    cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)psVar8);
    this->MemoryTesterStyle = 8;
    this->LogWithPID = true;
  }
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&memoryTesterOptions,"MemoryCheckType",(allocator<char> *)&extraOptions);
  cmCTest::GetCTestConfiguration(&testerName,pcVar2,&memoryTesterOptions);
  bVar4 = std::operator==(&testerName,"MemorySanitizer");
  std::__cxx11::string::~string((string *)&testerName);
  std::__cxx11::string::~string((string *)&memoryTesterOptions);
  if (bVar4) {
    cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)psVar8);
    this->MemoryTesterStyle = 9;
    this->LogWithPID = true;
  }
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&memoryTesterOptions,"MemoryCheckType",(allocator<char> *)&extraOptions);
  cmCTest::GetCTestConfiguration(&testerName,pcVar2,&memoryTesterOptions);
  bVar4 = std::operator==(&testerName,"UndefinedBehaviorSanitizer");
  std::__cxx11::string::~string((string *)&testerName);
  std::__cxx11::string::~string((string *)&memoryTesterOptions);
  if (bVar4) {
    cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)psVar8);
    this->MemoryTesterStyle = 10;
    this->LogWithPID = true;
  }
  else if (this->MemoryTesterStyle == 0) {
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&memoryTesterOptions,"MemoryCheckType",(allocator<char> *)&extraOptions);
    cmCTest::GetCTestConfiguration(&testerName,pcVar2,&memoryTesterOptions);
    std::__cxx11::string::~string((string *)&memoryTesterOptions);
    bVar4 = std::operator==(&testerName,"Purify");
    if (bVar4) {
      iVar9 = 2;
LAB_001d71fb:
      this->MemoryTesterStyle = iVar9;
    }
    else {
      bVar4 = std::operator==(&testerName,"BoundsChecker");
      if (bVar4) {
        iVar9 = 4;
        goto LAB_001d71fb;
      }
      bVar4 = std::operator==(&testerName,"Valgrind");
      if (bVar4) {
        iVar9 = 1;
        goto LAB_001d71fb;
      }
      bVar4 = std::operator==(&testerName,"DrMemory");
      if (bVar4) {
        iVar9 = 3;
        goto LAB_001d71fb;
      }
      bVar4 = std::operator==(&testerName,"CudaSanitizer");
      if (bVar4) {
        iVar9 = 5;
        goto LAB_001d71fb;
      }
    }
    std::__cxx11::string::~string((string *)&testerName);
  }
  if ((this->MemoryTester)._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&testerName);
    poVar7 = std::operator<<((ostream *)&testerName,
                             "Memory checker (MemoryCheckCommand) not set, or cannot find the specified program."
                            );
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x229,memoryTesterOptions._M_dataplus._M_p,
                 (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
    std::__cxx11::string::~string((string *)&memoryTesterOptions);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testerName);
    return false;
  }
  memoryTesterOptions._M_dataplus._M_p = (pointer)&memoryTesterOptions.field_2;
  memoryTesterOptions._M_string_length = 0;
  memoryTesterOptions.field_2._M_local_buf[0] = '\0';
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&extraOptions,"MemoryCheckCommandOptions",
             (allocator<char> *)&suppressionsOption);
  cmCTest::GetCTestConfiguration(&testerName,pcVar2,&extraOptions);
  sVar3 = testerName._M_string_length;
  std::__cxx11::string::~string((string *)&testerName);
  std::__cxx11::string::~string((string *)&extraOptions);
  if (sVar3 == 0) {
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extraOptions,"ValgrindCommandOptions",
               (allocator<char> *)&suppressionsOption);
    cmCTest::GetCTestConfiguration(&testerName,pcVar2,&extraOptions);
    sVar3 = testerName._M_string_length;
    std::__cxx11::string::~string((string *)&testerName);
    std::__cxx11::string::~string((string *)&extraOptions);
    if (sVar3 != 0) {
      pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&extraOptions,"ValgrindCommandOptions",
                 (allocator<char> *)&suppressionsOption);
      cmCTest::GetCTestConfiguration(&testerName,pcVar2,&extraOptions);
      goto LAB_001d74af;
    }
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extraOptions,"DrMemoryCommandOptions",
               (allocator<char> *)&suppressionsOption);
    cmCTest::GetCTestConfiguration(&testerName,pcVar2,&extraOptions);
    sVar3 = testerName._M_string_length;
    std::__cxx11::string::~string((string *)&testerName);
    std::__cxx11::string::~string((string *)&extraOptions);
    if (sVar3 != 0) {
      pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&extraOptions,"DrMemoryCommandOptions",
                 (allocator<char> *)&suppressionsOption);
      cmCTest::GetCTestConfiguration(&testerName,pcVar2,&extraOptions);
      goto LAB_001d74af;
    }
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extraOptions,"CudaSanitizerCommandOptions",
               (allocator<char> *)&suppressionsOption);
    cmCTest::GetCTestConfiguration(&testerName,pcVar2,&extraOptions);
    sVar3 = testerName._M_string_length;
    std::__cxx11::string::~string((string *)&testerName);
    std::__cxx11::string::~string((string *)&extraOptions);
    if (sVar3 != 0) {
      pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&extraOptions,"CudaSanitizerCommandOptions",
                 (allocator<char> *)&suppressionsOption);
      cmCTest::GetCTestConfiguration(&testerName,pcVar2,&extraOptions);
      goto LAB_001d74af;
    }
  }
  else {
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extraOptions,"MemoryCheckCommandOptions",
               (allocator<char> *)&suppressionsOption);
    cmCTest::GetCTestConfiguration(&testerName,pcVar2,&extraOptions);
LAB_001d74af:
    std::__cxx11::string::operator=((string *)&memoryTesterOptions,(string *)&testerName);
    std::__cxx11::string::~string((string *)&testerName);
    std::__cxx11::string::~string((string *)&extraOptions);
  }
  cmSystemTools::ParseArguments
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&testerName,&memoryTesterOptions);
  this_00 = &this->MemoryTesterOptions;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(this_00,&testerName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&testerName);
  cmCTest::GetBinaryDir_abi_cxx11_
            (&extraOptions,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
  std::operator+(&testerName,&extraOptions,"/Testing/Temporary/MemoryChecker.??.log");
  __rhs = &this->MemoryTesterOutputFile;
  std::__cxx11::string::operator=((string *)__rhs,(string *)&testerName);
  std::__cxx11::string::~string((string *)&testerName);
  std::__cxx11::string::~string((string *)&extraOptions);
  if (9 < this->MemoryTesterStyle - 1U) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&testerName);
    poVar7 = std::operator<<((ostream *)&testerName,"Do not understand memory checker: ");
    poVar7 = std::operator<<(poVar7,(string *)psVar8);
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x305,extraOptions._M_dataplus._M_p,false);
LAB_001d7fd9:
    std::__cxx11::string::~string((string *)&extraOptions);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testerName);
LAB_001d7ff0:
    bVar4 = false;
    goto LAB_001d78a3;
  }
  switch(this->MemoryTesterStyle) {
  case 1:
    if ((this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [3])0x792ec9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[16]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [16])"--tool=memcheck");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [17])"--leak-check=yes");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[21]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [21])"--show-reachable=yes");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [17])"--num-callers=50");
    }
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extraOptions,"MemoryCheckSuppressionFile",
               (allocator<char> *)&suppressionsOption);
    cmCTest::GetCTestConfiguration(&testerName,pcVar2,&extraOptions);
    sVar3 = testerName._M_string_length;
    std::__cxx11::string::~string((string *)&testerName);
    std::__cxx11::string::~string((string *)&extraOptions);
    if (sVar3 != 0) {
      pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&extraOptions,"MemoryCheckSuppressionFile",
                 (allocator<char> *)&suppressionsOption);
      cmCTest::GetCTestConfiguration(&testerName,pcVar2,&extraOptions);
      bVar4 = cmsys::SystemTools::FileExists(&testerName);
      std::__cxx11::string::~string((string *)&testerName);
      std::__cxx11::string::~string((string *)&extraOptions);
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&testerName);
        poVar7 = std::operator<<((ostream *)&testerName,
                                 "Cannot find memory checker suppression file: ");
        pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&suppressionsOption,"MemoryCheckSuppressionFile",
                   (allocator<char> *)&outputFile);
        cmCTest::GetCTestConfiguration(&extraOptions,pcVar2,&suppressionsOption);
        poVar7 = std::operator<<(poVar7,(string *)&extraOptions);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::string::~string((string *)&extraOptions);
        std::__cxx11::string::~string((string *)&suppressionsOption);
        pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,599,extraOptions._M_dataplus._M_p,false);
        goto LAB_001d7fd9;
      }
      pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&suppressionsOption,"MemoryCheckSuppressionFile",
                 (allocator<char> *)&outputFile);
      cmCTest::GetCTestConfiguration(&extraOptions,pcVar2,&suppressionsOption);
      std::operator+(&testerName,"--suppressions=",&extraOptions);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &testerName);
      std::__cxx11::string::~string((string *)&testerName);
      std::__cxx11::string::~string((string *)&extraOptions);
      std::__cxx11::string::~string((string *)&suppressionsOption);
    }
    std::operator+(&testerName,"--log-file=",__rhs);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,&testerName);
    break;
  case 2:
    testerName._M_string_length = 0;
    testerName.field_2._M_local_buf[0] = '\0';
    testerName._M_dataplus._M_p = (pointer)&testerName.field_2;
    std::__cxx11::string::assign((char *)&testerName);
    std::__cxx11::string::append((string *)&testerName);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->MemoryTesterDynamicOptions,&testerName);
    break;
  case 3:
    cmCTest::GetBinaryDir_abi_cxx11_
              (&testerName,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
    std::operator+(&extraOptions,&testerName,"/Testing/Temporary/DrMemory");
    std::__cxx11::string::~string((string *)&testerName);
    bVar4 = ::cm::
            contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[7],_0>
                      (this_00,(char (*) [7])0x708a4f);
    if (!bVar4) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[7]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [7])0x708a4f);
    }
    bVar4 = ::cm::
            contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[7],_0>
                      (this_00,(char (*) [7])"-batch");
    if (!bVar4) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[7]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [7])"-batch");
    }
    pvVar1 = &this->MemoryTesterDynamicOptions;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[8]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
               (char (*) [8])"-logdir");
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[8]>>
                      ((this->MemoryTesterOptions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->MemoryTesterOptions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"-logdir");
    if (_Var6._M_current ==
        (this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::operator+(&testerName,&extraOptions,"/??");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar1,&testerName);
      std::__cxx11::string::_M_assign((string *)__rhs);
      std::__cxx11::string::~string((string *)&testerName);
    }
    else {
      std::__cxx11::string::_M_assign((string *)__rhs);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar1,_Var6._M_current + 1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(this_00,(const_iterator)_Var6._M_current,_Var6._M_current + 2);
    }
    std::__cxx11::string::append((char *)__rhs);
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[14]>>
                      ((this->MemoryTesterOptions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->MemoryTesterOptions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"-symcache_dir");
    if (_Var6._M_current ==
        (this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[14]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 (char (*) [14])"-symcache_dir");
      std::operator+(&testerName,&extraOptions,"/cache");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar1,&testerName);
      std::__cxx11::string::~string((string *)&testerName);
    }
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&suppressionsOption,"MemoryCheckSuppressionFile",
               (allocator<char> *)&outputFile);
    cmCTest::GetCTestConfiguration(&testerName,pcVar2,&suppressionsOption);
    sVar3 = testerName._M_string_length;
    std::__cxx11::string::~string((string *)&testerName);
    std::__cxx11::string::~string((string *)&suppressionsOption);
    if (sVar3 != 0) {
      pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&suppressionsOption,"MemoryCheckSuppressionFile",
                 (allocator<char> *)&outputFile);
      cmCTest::GetCTestConfiguration(&testerName,pcVar2,&suppressionsOption);
      bVar4 = cmsys::SystemTools::FileExists(&testerName);
      std::__cxx11::string::~string((string *)&testerName);
      std::__cxx11::string::~string((string *)&suppressionsOption);
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&testerName);
        poVar7 = std::operator<<((ostream *)&testerName,
                                 "Cannot find memory checker suppression file: ");
        pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&outputFile,"MemoryCheckSuppressionFile",(allocator<char> *)&local_208)
        ;
        cmCTest::GetCTestConfiguration(&suppressionsOption,pcVar2,&outputFile);
        poVar7 = std::operator<<(poVar7,(string *)&suppressionsOption);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::string::~string((string *)&suppressionsOption);
        std::__cxx11::string::~string((string *)&outputFile);
        pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x290,suppressionsOption._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&suppressionsOption);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testerName);
        std::__cxx11::string::~string((string *)&extraOptions);
        goto LAB_001d7ff0;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[10]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [10])"-suppress");
      pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&suppressionsOption,"MemoryCheckSuppressionFile",
                 (allocator<char> *)&outputFile);
      cmCTest::GetCTestConfiguration(&testerName,pcVar2,&suppressionsOption);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &testerName);
      std::__cxx11::string::~string((string *)&testerName);
      std::__cxx11::string::~string((string *)&suppressionsOption);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [3])0x779ff9);
    psVar8 = &extraOptions;
    goto LAB_001d7893;
  case 4:
    std::__cxx11::string::_M_assign((string *)&this->BoundsCheckerXMLFile);
    cmCTest::GetBinaryDir_abi_cxx11_
              (&extraOptions,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
    std::operator+(&testerName,&extraOptions,"/Testing/Temporary/MemoryChecker.??.DPbd");
    std::__cxx11::string::~string((string *)&extraOptions);
    std::__cxx11::string::_M_assign((string *)&this->BoundsCheckerDPBDFile);
    pvVar1 = &this->MemoryTesterDynamicOptions;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
               (char (*) [3])"/B");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
               &testerName);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
               (char (*) [3])"/X");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar1,__rhs);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [3])"/M");
    break;
  case 5:
    if ((this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[7]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [7])"--tool");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[9]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [9])0x7090f7);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[13]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [13])"--leak-check");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[5]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [5])0x7b83d3);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[11]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [11])"--log-file");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->MemoryTesterDynamicOptions,__rhs);
    goto LAB_001d7898;
  default:
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [3])"-E");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [4])0x715961);
    testerName._M_string_length = 0;
    extraOptions._M_dataplus._M_p = (pointer)&extraOptions.field_2;
    extraOptions._M_string_length = 0;
    suppressionsOption._M_dataplus._M_p = (pointer)&suppressionsOption.field_2;
    suppressionsOption._M_string_length = 0;
    extraOptions.field_2._M_local_buf[0] = '\0';
    testerName.field_2._M_local_buf[0] = '\0';
    suppressionsOption.field_2._M_local_buf[0] = '\0';
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    testerName._M_dataplus._M_p = (pointer)&testerName.field_2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"MemoryCheckSanitizerOptions",(allocator<char> *)&local_1c8);
    cmCTest::GetCTestConfiguration(&outputFile,pcVar2,&local_208);
    sVar3 = outputFile._M_string_length;
    std::__cxx11::string::~string((string *)&outputFile);
    std::__cxx11::string::~string((string *)&local_208);
    if (sVar3 != 0) {
      pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"MemoryCheckSanitizerOptions",&local_229);
      cmCTest::GetCTestConfiguration(&local_208,pcVar2,&local_1c8);
      std::operator+(&outputFile,":",&local_208);
      std::__cxx11::string::operator=((string *)&extraOptions,(string *)&outputFile);
      std::__cxx11::string::~string((string *)&outputFile);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"MemoryCheckSuppressionFile",(allocator<char> *)&local_1c8);
    cmCTest::GetCTestConfiguration(&outputFile,pcVar2,&local_208);
    std::__cxx11::string::~string((string *)&outputFile);
    std::__cxx11::string::~string((string *)&local_208);
    if (outputFile._M_string_length != 0) {
      pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"MemoryCheckSuppressionFile",&local_229);
      cmCTest::GetCTestConfiguration(&local_208,pcVar2,&local_1c8);
      std::operator+(&outputFile,":suppressions=",&local_208);
      std::__cxx11::string::operator=((string *)&suppressionsOption,(string *)&outputFile);
      std::__cxx11::string::~string((string *)&outputFile);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    if (this->MemoryTesterStyle - 6U < 5) {
      std::__cxx11::string::assign((char *)&testerName);
    }
    std::operator+(&local_1c8,&testerName,"=log_path=\'");
    std::operator+(&local_208,&local_1c8,__rhs);
    std::operator+(&outputFile,&local_208,"\'");
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::operator+(&local_1c8,&outputFile,&suppressionsOption);
    std::operator+(&local_208,&local_1c8,&extraOptions);
    std::__cxx11::string::operator=
              ((string *)&this->MemoryTesterEnvironmentVariable,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&outputFile);
    std::__cxx11::string::~string((string *)&suppressionsOption);
    std::__cxx11::string::~string((string *)&extraOptions);
  }
  psVar8 = &testerName;
LAB_001d7893:
  std::__cxx11::string::~string((string *)psVar8);
LAB_001d7898:
  bVar4 = true;
  InitializeResultsVectors(this);
LAB_001d78a3:
  std::__cxx11::string::~string((string *)&memoryTesterOptions);
  return bVar4;
}

Assistant:

bool cmCTestMemCheckHandler::InitializeMemoryChecking()
{
  this->MemoryTesterEnvironmentVariable.clear();
  this->MemoryTester.clear();
  // Setup the command
  if (cmSystemTools::FileExists(
        this->CTest->GetCTestConfiguration("MemoryCheckCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("MemoryCheckCommand");
    std::string testerName =
      cmSystemTools::GetFilenameName(this->MemoryTester);
    // determine the checker type
    if (testerName.find("valgrind") != std::string::npos ||
        this->CTest->GetCTestConfiguration("MemoryCheckType") == "Valgrind") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
    } else if (testerName.find("drmemory") != std::string::npos ||
               this->CTest->GetCTestConfiguration("MemoryCheckType") ==
                 "DrMemory") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::DRMEMORY;
    } else if (testerName.find("purify") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
    } else if (testerName.find("BC") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
    } else if (testerName.find("cuda-memcheck") != std::string::npos ||
               testerName.find("compute-sanitizer") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::CUDA_SANITIZER;
    } else {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::UNKNOWN;
    }
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("PurifyCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("PurifyCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("ValgrindCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("ValgrindCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("DrMemoryCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("DrMemoryCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::DRMEMORY;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("BoundsCheckerCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("BoundsCheckerCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("CudaSanitizerCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("CudaSanitizerCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::CUDA_SANITIZER;
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "AddressSanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::ADDRESS_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "LeakSanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::LEAK_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "ThreadSanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::THREAD_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "MemorySanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::MEMORY_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "UndefinedBehaviorSanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::UB_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  // Check the MemoryCheckType
  if (this->MemoryTesterStyle == cmCTestMemCheckHandler::UNKNOWN) {
    std::string checkType =
      this->CTest->GetCTestConfiguration("MemoryCheckType");
    if (checkType == "Purify") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
    } else if (checkType == "BoundsChecker") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
    } else if (checkType == "Valgrind") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
    } else if (checkType == "DrMemory") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::DRMEMORY;
    } else if (checkType == "CudaSanitizer") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::CUDA_SANITIZER;
    }
  }
  if (this->MemoryTester.empty()) {
    cmCTestOptionalLog(this->CTest, WARNING,
                       "Memory checker (MemoryCheckCommand) "
                       "not set, or cannot find the specified program."
                         << std::endl,
                       this->Quiet);
    return false;
  }

  // Setup the options
  std::string memoryTesterOptions;
  if (!this->CTest->GetCTestConfiguration("MemoryCheckCommandOptions")
         .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("MemoryCheckCommandOptions");
  } else if (!this->CTest->GetCTestConfiguration("ValgrindCommandOptions")
                .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("ValgrindCommandOptions");
  } else if (!this->CTest->GetCTestConfiguration("DrMemoryCommandOptions")
                .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("DrMemoryCommandOptions");
  } else if (!this->CTest->GetCTestConfiguration("CudaSanitizerCommandOptions")
                .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("CudaSanitizerCommandOptions");
  }
  this->MemoryTesterOptions =
    cmSystemTools::ParseArguments(memoryTesterOptions);

  this->MemoryTesterOutputFile =
    this->CTest->GetBinaryDir() + "/Testing/Temporary/MemoryChecker.??.log";

  switch (this->MemoryTesterStyle) {
    case cmCTestMemCheckHandler::VALGRIND: {
      if (this->MemoryTesterOptions.empty()) {
        this->MemoryTesterOptions.emplace_back("-q");
        this->MemoryTesterOptions.emplace_back("--tool=memcheck");
        this->MemoryTesterOptions.emplace_back("--leak-check=yes");
        this->MemoryTesterOptions.emplace_back("--show-reachable=yes");
        this->MemoryTesterOptions.emplace_back("--num-callers=50");
      }
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot find memory checker suppression file: "
                       << this->CTest->GetCTestConfiguration(
                            "MemoryCheckSuppressionFile")
                       << std::endl);
          return false;
        }
        this->MemoryTesterOptions.push_back(
          "--suppressions=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile"));
      }
      this->MemoryTesterDynamicOptions.push_back("--log-file=" +
                                                 this->MemoryTesterOutputFile);
      break;
    }
    case cmCTestMemCheckHandler::DRMEMORY: {
      std::string tempDrMemoryDir =
        this->CTest->GetBinaryDir() + "/Testing/Temporary/DrMemory";

      if (!cm::contains(this->MemoryTesterOptions, "-quiet")) {
        this->MemoryTesterOptions.emplace_back("-quiet");
      }

      if (!cm::contains(this->MemoryTesterOptions, "-batch")) {
        this->MemoryTesterOptions.emplace_back("-batch");
      }

      this->MemoryTesterDynamicOptions.emplace_back("-logdir");
      auto logdirOption =
        std::find(this->MemoryTesterOptions.begin(),
                  this->MemoryTesterOptions.end(), "-logdir");
      if (logdirOption == this->MemoryTesterOptions.end()) {
        // No logdir found in memory tester options
        std::string drMemoryLogDir = tempDrMemoryDir + "/??";
        this->MemoryTesterDynamicOptions.push_back(drMemoryLogDir);
        this->MemoryTesterOutputFile = drMemoryLogDir;
      } else {
        // Use logdir found in memory tester options
        auto logdirLocation = std::next(logdirOption);
        this->MemoryTesterOutputFile = *logdirLocation;
        this->MemoryTesterDynamicOptions.push_back(*logdirLocation);
        this->MemoryTesterOptions.erase(logdirOption, logdirLocation + 1);
      }
      this->MemoryTesterOutputFile += "/*/results.txt";

      if (std::find(this->MemoryTesterOptions.begin(),
                    this->MemoryTesterOptions.end(),
                    "-symcache_dir") == this->MemoryTesterOptions.end()) {
        this->MemoryTesterDynamicOptions.emplace_back("-symcache_dir");
        std::string drMemoryCacheDir = tempDrMemoryDir + "/cache";
        this->MemoryTesterDynamicOptions.push_back(drMemoryCacheDir);
      }

      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot find memory checker suppression file: "
                       << this->CTest->GetCTestConfiguration(
                            "MemoryCheckSuppressionFile")
                       << std::endl);
          return false;
        }
        this->MemoryTesterOptions.emplace_back("-suppress");
        this->MemoryTesterOptions.push_back(
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile"));
      }

      this->MemoryTesterOptions.emplace_back("--");

      break;
    }
    case cmCTestMemCheckHandler::PURIFY: {
      std::string outputFile;
#ifdef _WIN32
      if (this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
            .size()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(
            this->CTest, ERROR_MESSAGE,
            "Cannot find memory checker suppression file: "
              << this->CTest
                   ->GetCTestConfiguration("MemoryCheckSuppressionFile")
                   .c_str()
              << std::endl);
          return false;
        }
        std::string filterFiles = "/FilterFiles=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile");
        this->MemoryTesterOptions.push_back(filterFiles);
      }
      outputFile = "/SAVETEXTDATA=";
#else
      outputFile = "-log-file=";
#endif
      outputFile += this->MemoryTesterOutputFile;
      this->MemoryTesterDynamicOptions.push_back(outputFile);
      break;
    }
    case cmCTestMemCheckHandler::BOUNDS_CHECKER: {
      this->BoundsCheckerXMLFile = this->MemoryTesterOutputFile;
      std::string dpbdFile = this->CTest->GetBinaryDir() +
        "/Testing/Temporary/MemoryChecker.??.DPbd";
      this->BoundsCheckerDPBDFile = dpbdFile;
      this->MemoryTesterDynamicOptions.emplace_back("/B");
      this->MemoryTesterDynamicOptions.push_back(std::move(dpbdFile));
      this->MemoryTesterDynamicOptions.emplace_back("/X");
      this->MemoryTesterDynamicOptions.push_back(this->MemoryTesterOutputFile);
      this->MemoryTesterOptions.emplace_back("/M");
      break;
    }
    case cmCTestMemCheckHandler::CUDA_SANITIZER: {
      // cuda sanitizer separates flags from arguments by spaces
      if (this->MemoryTesterOptions.empty()) {
        this->MemoryTesterOptions.emplace_back("--tool");
        this->MemoryTesterOptions.emplace_back("memcheck");
        this->MemoryTesterOptions.emplace_back("--leak-check");
        this->MemoryTesterOptions.emplace_back("full");
      }
      this->MemoryTesterDynamicOptions.emplace_back("--log-file");
      this->MemoryTesterDynamicOptions.push_back(this->MemoryTesterOutputFile);
      break;
    }
    // these are almost the same but the env var used is different
    case cmCTestMemCheckHandler::ADDRESS_SANITIZER:
    case cmCTestMemCheckHandler::LEAK_SANITIZER:
    case cmCTestMemCheckHandler::THREAD_SANITIZER:
    case cmCTestMemCheckHandler::MEMORY_SANITIZER:
    case cmCTestMemCheckHandler::UB_SANITIZER: {
      // To pass arguments to ThreadSanitizer the environment variable
      // TSAN_OPTIONS is used. This is done with the cmake -E env command.
      // The MemoryTesterDynamicOptions is setup with the -E env
      // Then the MemoryTesterEnvironmentVariable gets the
      // TSAN_OPTIONS string with the log_path in it.
      this->MemoryTesterDynamicOptions.emplace_back("-E");
      this->MemoryTesterDynamicOptions.emplace_back("env");
      std::string envVar;
      std::string extraOptions;
      std::string suppressionsOption;
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSanitizerOptions")
             .empty()) {
        extraOptions = ":" +
          this->CTest->GetCTestConfiguration("MemoryCheckSanitizerOptions");
      }
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        suppressionsOption = ":suppressions=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile");
      }
      if (this->MemoryTesterStyle ==
          cmCTestMemCheckHandler::ADDRESS_SANITIZER) {
        envVar = "ASAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::LEAK_SANITIZER) {
        envVar = "LSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::THREAD_SANITIZER) {
        envVar = "TSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::MEMORY_SANITIZER) {
        envVar = "MSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::UB_SANITIZER) {
        envVar = "UBSAN_OPTIONS";
      }
      // Quote log_path with single quotes; see
      // https://bugs.chromium.org/p/chromium/issues/detail?id=467936
      std::string outputFile =
        envVar + "=log_path='" + this->MemoryTesterOutputFile + "'";
      this->MemoryTesterEnvironmentVariable =
        outputFile + suppressionsOption + extraOptions;
      break;
    }
    default:
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Do not understand memory checker: " << this->MemoryTester
                                                      << std::endl);
      return false;
  }

  this->InitializeResultsVectors();
  // std::vector<std::string>::size_type cc;
  // for ( cc = 0; cmCTestMemCheckResultStrings[cc]; cc ++ )
  //   {
  //   this->MemoryTesterGlobalResults[cc] = 0;
  //   }
  return true;
}